

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_sharing.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  pair<double,_double> pVar6;
  
  dVar4 = 0.0;
  iVar2 = 100;
  dVar5 = 0.0;
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    pVar6 = runBenchmark();
    dVar5 = dVar5 + pVar6.first;
    dVar4 = dVar4 + pVar6.second;
  }
  std::operator<<((ostream *)&std::cout,"Close togeher: ");
  poVar1 = std::ostream::_M_insert<double>(dVar5 / 100.0);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"Far apart: ");
  poVar1 = std::ostream::_M_insert<double>(dVar4 / 100.0);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main() {
  double s1 = 0;
  double s2 = 0;
  for (int i = 0; i != ITERATIONS; ++i) {
    auto p = runBenchmark();
    s1 += p.first;
    s2 += p.second;
  }
  s1 = s1 / ITERATIONS;
  s2 = s2 / ITERATIONS;
  std::cout << "Close togeher: " << s1 << std::endl;
  std::cout << "Far apart: " << s2 << std::endl;
}